

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O2

int __thiscall AES256CBCEncrypt::Encrypt(AES256CBCEncrypt *this,uchar *data,int size,uchar *out)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  long in_FS_OFFSET;
  uchar mixed [16];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = this->pad;
  uVar5 = size % 0x10;
  uVar6 = 0;
  if (((uVar5 == 0 | bVar2) & (out != (uchar *)0x0 && (size != 0 && data != (uchar *)0x0))) == 1) {
    mixed._0_8_ = *(undefined8 *)this->iv;
    mixed._8_8_ = *(undefined8 *)(this->iv + 8);
    uVar6 = 0;
    while (uVar1 = uVar6 + 0x10, (long)uVar1 <= (long)size) {
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        mixed[lVar7] = mixed[lVar7] ^ data[lVar7];
      }
      AES256Encrypt::Encrypt(&this->enc,out + uVar6,mixed);
      mixed._0_8_ = *(undefined8 *)(out + uVar6);
      mixed._8_8_ = *(undefined8 *)(out + uVar6 + 8);
      data = data + 0x10;
      uVar6 = uVar1;
    }
    if (bVar2 != false) {
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        mixed[uVar4] = mixed[uVar4] ^ data[uVar4];
      }
      for (lVar7 = (long)(int)uVar5; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        mixed[lVar7] = mixed[lVar7] ^ 0x10U - (char)uVar5;
      }
      AES256Encrypt::Encrypt(&this->enc,out + (uVar6 & 0xffffffff),mixed);
      uVar6 = uVar1 & 0xffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (int)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

int AES256CBCEncrypt::Encrypt(const unsigned char* data, int size, unsigned char* out) const
{
    return CBCEncrypt(enc, iv, data, size, pad, out);
}